

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v9::detail::buffer<wchar_t>::append<wchar_t>(buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  ulong uVar1;
  ulong uVar2;
  
  if (begin != end) {
    do {
      uVar1 = (long)end - (long)begin >> 2;
      if ((long)uVar1 < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/fmt-src/include/fmt/core.h"
                    ,0x199,"negative value");
      }
      if (this->capacity_ < this->size_ + uVar1) {
        (**this->_vptr_buffer)(this);
      }
      uVar2 = this->capacity_ - this->size_;
      if (uVar1 <= uVar2) {
        uVar2 = uVar1;
      }
      if (uVar2 != 0) {
        memmove(this->ptr_ + this->size_,begin,uVar2 * 4);
      }
      this->size_ = this->size_ + uVar2;
      begin = begin + uVar2;
    } while (begin != end);
  }
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  while (begin != end) {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, make_checked(ptr_ + size_, count));
    size_ += count;
    begin += count;
  }
}